

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_overview_txt_actions::module2(module_overview_txt_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  module_overview_txt_actions *this_local;
  
  if ((this->deps_ & 1U) == 0) {
    std::operator<<((ostream *)&std::cout," ->");
    this->deps_ = true;
  }
  poVar1 = std::operator<<((ostream *)&std::cout," ");
  std::operator<<(poVar1,(string *)module);
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( !deps_ )
        {
            std::cout << " ->";
            deps_ = true;
        }

        std::cout << " " << module;
    }